

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O0

uint8_t winmd::reader::database::
        composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::Param>,winmd::reader::table<winmd::reader::InterfaceImpl>,winmd::reader::table<winmd::reader::MemberRef>,winmd::reader::table<winmd::reader::Module>,winmd::reader::table<winmd::reader::Property>,winmd::reader::table<winmd::reader::Event>,winmd::reader::table<winmd::reader::StandAloneSig>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::TypeSpec>,winmd::reader::table<winmd::reader::Assembly>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::File>,winmd::reader::table<winmd::reader::ExportedType>,winmd::reader::table<winmd::reader::ManifestResource>,winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::table<winmd::reader::GenericParamConstraint>,winmd::reader::table<winmd::reader::MethodSpec>>
                  (table<winmd::reader::MethodDef> *tables,table<winmd::reader::Field> *tables_1,
                  table<winmd::reader::TypeRef> *tables_2,table<winmd::reader::TypeDef> *tables_3,
                  table<winmd::reader::Param> *tables_4,
                  table<winmd::reader::InterfaceImpl> *tables_5,
                  table<winmd::reader::MemberRef> *tables_6,table<winmd::reader::Module> *tables_7,
                  table<winmd::reader::Property> *tables_8,table<winmd::reader::Event> *tables_9,
                  table<winmd::reader::StandAloneSig> *tables_10,
                  table<winmd::reader::ModuleRef> *tables_11,
                  table<winmd::reader::TypeSpec> *tables_12,
                  table<winmd::reader::Assembly> *tables_13,
                  table<winmd::reader::AssemblyRef> *tables_14,table<winmd::reader::File> *tables_15
                  ,table<winmd::reader::ExportedType> *tables_16,
                  table<winmd::reader::ManifestResource> *tables_17,
                  table<winmd::reader::GenericParam> *tables_18,
                  table<winmd::reader::GenericParamConstraint> *tables_19,
                  table<winmd::reader::MethodSpec> *tables_20)

{
  uint8_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined1 local_d1;
  undefined1 local_c9;
  undefined1 local_c1;
  undefined1 local_b9;
  undefined1 local_b1;
  undefined1 local_a9;
  undefined1 local_a1;
  undefined1 local_99;
  undefined1 local_91;
  undefined1 local_89;
  undefined1 local_81;
  undefined1 local_79;
  undefined1 local_71;
  undefined1 local_69;
  undefined1 local_61;
  undefined1 local_59;
  undefined1 local_51;
  undefined1 local_49;
  undefined1 local_41;
  undefined1 local_39;
  table<winmd::reader::InterfaceImpl> *tables_local_5;
  table<winmd::reader::Param> *tables_local_4;
  table<winmd::reader::TypeDef> *tables_local_3;
  table<winmd::reader::TypeRef> *tables_local_2;
  table<winmd::reader::Field> *tables_local_1;
  table<winmd::reader::MethodDef> *tables_local;
  
  uVar3 = table_base::size(&tables->super_table_base);
  uVar1 = impl::bits_needed(0x15);
  bVar2 = composite_index_size(uVar3,uVar1);
  local_39 = false;
  if (bVar2) {
    uVar3 = table_base::size(&tables_1->super_table_base);
    uVar1 = impl::bits_needed(0x15);
    bVar2 = composite_index_size(uVar3,uVar1);
    local_41 = false;
    if (bVar2) {
      uVar3 = table_base::size(&tables_2->super_table_base);
      uVar1 = impl::bits_needed(0x15);
      bVar2 = composite_index_size(uVar3,uVar1);
      local_49 = false;
      if (bVar2) {
        uVar3 = table_base::size(&tables_3->super_table_base);
        uVar1 = impl::bits_needed(0x15);
        bVar2 = composite_index_size(uVar3,uVar1);
        local_51 = false;
        if (bVar2) {
          uVar3 = table_base::size(&tables_4->super_table_base);
          uVar1 = impl::bits_needed(0x15);
          bVar2 = composite_index_size(uVar3,uVar1);
          local_59 = false;
          if (bVar2) {
            uVar3 = table_base::size(&tables_5->super_table_base);
            uVar1 = impl::bits_needed(0x15);
            bVar2 = composite_index_size(uVar3,uVar1);
            local_61 = false;
            if (bVar2) {
              uVar3 = table_base::size(&tables_6->super_table_base);
              uVar1 = impl::bits_needed(0x15);
              bVar2 = composite_index_size(uVar3,uVar1);
              local_69 = false;
              if (bVar2) {
                uVar3 = table_base::size(&tables_7->super_table_base);
                uVar1 = impl::bits_needed(0x15);
                bVar2 = composite_index_size(uVar3,uVar1);
                local_71 = false;
                if (bVar2) {
                  uVar3 = table_base::size(&tables_8->super_table_base);
                  uVar1 = impl::bits_needed(0x15);
                  bVar2 = composite_index_size(uVar3,uVar1);
                  local_79 = false;
                  if (bVar2) {
                    uVar3 = table_base::size(&tables_9->super_table_base);
                    uVar1 = impl::bits_needed(0x15);
                    bVar2 = composite_index_size(uVar3,uVar1);
                    local_81 = false;
                    if (bVar2) {
                      uVar3 = table_base::size(&tables_10->super_table_base);
                      uVar1 = impl::bits_needed(0x15);
                      bVar2 = composite_index_size(uVar3,uVar1);
                      local_89 = false;
                      if (bVar2) {
                        uVar3 = table_base::size(&tables_11->super_table_base);
                        uVar1 = impl::bits_needed(0x15);
                        bVar2 = composite_index_size(uVar3,uVar1);
                        local_91 = false;
                        if (bVar2) {
                          uVar3 = table_base::size(&tables_12->super_table_base);
                          uVar1 = impl::bits_needed(0x15);
                          bVar2 = composite_index_size(uVar3,uVar1);
                          local_99 = false;
                          if (bVar2) {
                            uVar3 = table_base::size(&tables_13->super_table_base);
                            uVar1 = impl::bits_needed(0x15);
                            bVar2 = composite_index_size(uVar3,uVar1);
                            local_a1 = false;
                            if (bVar2) {
                              uVar3 = table_base::size(&tables_14->super_table_base);
                              uVar1 = impl::bits_needed(0x15);
                              bVar2 = composite_index_size(uVar3,uVar1);
                              local_a9 = false;
                              if (bVar2) {
                                uVar3 = table_base::size(&tables_15->super_table_base);
                                uVar1 = impl::bits_needed(0x15);
                                bVar2 = composite_index_size(uVar3,uVar1);
                                local_b1 = false;
                                if (bVar2) {
                                  uVar3 = table_base::size(&tables_16->super_table_base);
                                  uVar1 = impl::bits_needed(0x15);
                                  bVar2 = composite_index_size(uVar3,uVar1);
                                  local_b9 = false;
                                  if (bVar2) {
                                    uVar3 = table_base::size(&tables_17->super_table_base);
                                    uVar1 = impl::bits_needed(0x15);
                                    bVar2 = composite_index_size(uVar3,uVar1);
                                    local_c1 = false;
                                    if (bVar2) {
                                      uVar3 = table_base::size(&tables_18->super_table_base);
                                      uVar1 = impl::bits_needed(0x15);
                                      bVar2 = composite_index_size(uVar3,uVar1);
                                      local_c9 = false;
                                      if (bVar2) {
                                        uVar3 = table_base::size(&tables_19->super_table_base);
                                        uVar1 = impl::bits_needed(0x15);
                                        bVar2 = composite_index_size(uVar3,uVar1);
                                        local_d1 = false;
                                        if (bVar2) {
                                          uVar3 = table_base::size(&tables_20->super_table_base);
                                          uVar1 = impl::bits_needed(0x15);
                                          local_d1 = composite_index_size(uVar3,uVar1);
                                        }
                                        local_c9 = local_d1;
                                      }
                                      local_c1 = local_c9;
                                    }
                                    local_b9 = local_c1;
                                  }
                                  local_b1 = local_b9;
                                }
                                local_a9 = local_b1;
                              }
                              local_a1 = local_a9;
                            }
                            local_99 = local_a1;
                          }
                          local_91 = local_99;
                        }
                        local_89 = local_91;
                      }
                      local_81 = local_89;
                    }
                    local_79 = local_81;
                  }
                  local_71 = local_79;
                }
                local_69 = local_71;
              }
              local_61 = local_69;
            }
            local_59 = local_61;
          }
          local_51 = local_59;
        }
        local_49 = local_51;
      }
      local_41 = local_49;
    }
    local_39 = local_41;
  }
  uVar1 = '\x04';
  if (local_39 != false) {
    uVar1 = '\x02';
  }
  return uVar1;
}

Assistant:

static uint8_t composite_index_size(Tables const&... tables)
        {
            return (composite_index_size(tables.size(), impl::bits_needed(sizeof...(tables))) && ...) ? 2 : 4;
        }